

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::ThreadContext
          (ThreadContext *this,AllocationPolicyManager *allocationPolicyManager,
          ThreadServiceCallback threadServiceCallback,bool enableExperimentalFeatures)

{
  ThreadServiceCallback p_Var1;
  DWORD DVar2;
  uint uVar3;
  PageAllocator *pPVar4;
  HANDLE pVVar5;
  PreReservedVirtualAllocWrapper *virtualAllocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_00;
  ArenaAllocator *alloc;
  void **ppvVar7;
  DynamicProfileMutator *pDVar8;
  CriticalSection *cs;
  time_t tVar9;
  uint local_22c;
  AutoCriticalSection local_b0;
  AutoCriticalSection autocs;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  byte local_21;
  ThreadServiceCallback p_Stack_20;
  bool enableExperimentalFeatures_local;
  ThreadServiceCallback threadServiceCallback_local;
  AllocationPolicyManager *allocationPolicyManager_local;
  ThreadContext *this_local;
  
  local_21 = enableExperimentalFeatures;
  p_Stack_20 = threadServiceCallback;
  threadServiceCallback_local = (ThreadServiceCallback)allocationPolicyManager;
  allocationPolicyManager_local = (AllocationPolicyManager *)this;
  Memory::DefaultRecyclerCollectionWrapper::DefaultRecyclerCollectionWrapper
            (&this->super_DefaultRecyclerCollectionWrapper);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::DoublyLinkedListElement
            (&this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>);
  ThreadContextInfo::ThreadContextInfo(&this->super_ThreadContextInfo);
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _vptr_RecyclerCollectionWrapper = (_func_int **)&PTR_PreCollectionCallBack_01de2e40;
  (this->super_ThreadContextInfo)._vptr_ThreadContextInfo =
       (_func_int **)&PTR_GetProcessHandle_01de2f40;
  this->emptyStringPropertyRecord = (PropertyRecord *)0x0;
  this->noScriptScope = false;
  this->debugManager = (DebugManager *)0x0;
  this->heapEnum = (IActiveScriptProfilerHeapEnum *)0x0;
  this->propertyMap = (PropertyMap *)0x0;
  this->m_remoteThreadContextInfo = (PTHREADCONTEXT_HANDLE)0x0;
  this->m_prereservedRegionAddr = 0;
  this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
  this->m_jitNeedsPropertyUpdate = false;
  this->threadContextFlags = ThreadContextFlagNoFlag;
  DVar2 = ::GetCurrentThreadId();
  this->currentThreadId = DVar2;
  this->stackLimitForCurrentThread = 0;
  this->stackProber = (StackProber *)0x0;
  this->isThreadBound = false;
  this->hasThrownPendingException = false;
  this->hasBailedOutBitPtr = (bool *)0x0;
  this->noJsReentrancy = false;
  this->reentrancySafeOrHandled = false;
  this->isInReentrancySafeRegion = false;
  this->allocationPolicyManager = (AllocationPolicyManager *)threadServiceCallback_local;
  JsUtil::ThreadService::ThreadService(&this->threadService,p_Stack_20);
  Memory::PreReservedVirtualAllocWrapper::PreReservedVirtualAllocWrapper
            (&this->preReservedVirtualAllocator);
  this->callRootLevel = 0;
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundPageQueue::BackgroundPageQueue(&this->backgroundPageQueue);
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            (&this->pageAllocator,(AllocationPolicyManager *)threadServiceCallback_local,
             PageAllocatorType_Thread,(ConfigFlagsTable *)&Js::Configuration::Global,0,
             Memory::RecyclerHeuristic::Instance.DefaultMaxFreePageCount,false,
             &this->backgroundPageQueue,0x20,false);
  this->recycler = (Recycler *)0x0;
  Js::DelayedFreeArrayBuffer::DelayedFreeArrayBuffer(&this->delayFreeCallback);
  this->caseInvariantPropertySet = (PropertyNoCaseSetType *)0x0;
  this->rootPendingClose = (ScriptContext *)0x0;
  this->entryExitRecord = (ScriptEntryExitRecord *)0x0;
  this->leafInterpreterFrame = (InterpreterStackFrame *)0x0;
  pPVar4 = GetPageAllocator(this);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->threadAlloc,L"TC",pPVar4,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  p_Var1 = threadServiceCallback_local;
  this->threadServiceWrapper = (ThreadServiceWrapper *)0x0;
  this->tryHandlerAddrOfReturnAddr = (void *)0x0;
  this->redeferralState = InitialRedeferralState;
  this->gcSinceLastRedeferral = 0;
  this->gcSinceCallCountsCollected = 0;
  this->nextTypeId = 0x800;
  this->polymorphicCacheState = 0;
  this->jobProcessor = (JobProcessor *)0x0;
  pVVar5 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->thunkPageAllocators,(AllocationPolicyManager *)p_Var1,false,
                     (PreReservedVirtualAllocWrapper *)0x0,pVVar5);
  p_Var1 = threadServiceCallback_local;
  virtualAllocator = GetPreReservedVirtualAllocator(this);
  pVVar5 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->codePageAllocators,(AllocationPolicyManager *)p_Var1,true,
                     virtualAllocator,pVVar5);
  Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::RecyclerRootPtr(&this->recyclableData);
  this->temporaryArenaAllocatorCount = 0;
  this->temporaryGuestArenaAllocatorCount = 0;
  this->topLevelScriptSite = (ScriptSite *)0x0;
  this->scriptContextList = (ScriptContext *)0x0;
  this->scriptContextEverRegistered = false;
  this->nativeCodeSize = 0;
  this->sourceCodeSize = 0;
  PlatformAgnostic::DateTime::HiResTimer::HiResTimer(&this->hTimer);
  this->stackProbeCount = 0;
  this->exceptionCode = 0;
  pPVar4 = GetPageAllocator(this);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->inlineCacheThreadInfoAllocator,L"TC-InlineCacheInfo",pPVar4,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar4 = GetPageAllocator(this);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->isInstInlineCacheThreadInfoAllocator,L"TC-IsInstInlineCacheInfo",pPVar4,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar4 = GetPageAllocator(this);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->equivalentTypeCacheInfoAllocator,L"TC-EquivalentTypeCacheInfo",pPVar4,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  DListBase<Js::EntryPointInfo_*,_RealCount>::DListBase(&this->equivalentTypeCacheEntryPoints);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->protoInlineCacheByPropId,&this->inlineCacheThreadInfoAllocator,0x209);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->storeFieldInlineCacheByPropId,&this->inlineCacheThreadInfoAllocator,0x125)
  ;
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->isInstInlineCacheByFunction,&this->isInstInlineCacheThreadInfoAllocator,
                   0x83);
  Js::IsConcatSpreadableCache::IsConcatSpreadableCache(&this->isConcatSpreadableCache);
  pPVar4 = GetPageAllocator(this);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::ThreadCacheRegistry
            (&this->noSpecialPropertyRegistry,pPVar4);
  pPVar4 = GetPageAllocator(this);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
  ThreadCacheRegistry(&this->onlyWritablePropertyRegistry,pPVar4);
  DListBase<ThreadContext::CollectCallBack,_RealCount>::DListBase(&this->collectCallBackList);
  CriticalSection::CriticalSection(&this->csCollectionCallBack,0);
  this->hasCollectionCallBack = false;
  this->isOptimizedForManyInstances = (bool)(DAT_01ec73e4 & 1);
  this->bgJit = (bool)(DAT_01e9e2f1 & 1);
  this->isProfilingUserCode = true;
  this->jsrtRuntime = (void *)0x0;
  this->hasUnhandledException = false;
  this->hasCatchHandler = false;
  this->disableImplicitFlags = DisableImplicitNoFlag;
  this->hasCatchHandlerToUserCode = false;
  this->crefSContextForDiag = 0;
  Entropy::Entropy(&this->entropy);
  this->standardUTF8Chars = (StandardChars<unsigned_char> *)0x0;
  this->standardUnicodeChars = (StandardChars<char16_t> *)0x0;
  CriticalSection::CriticalSection(&this->csFunctionBody,0);
  Js::Amd64ContextsManager::Amd64ContextsManager(&this->amd64ContextsManager);
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->dynamicObjectEnumeratorCacheMap,&Memory::HeapAllocator::Instance,0x10);
  NativeLibraryEntryRecord::NativeLibraryEntryRecord(&this->nativeLibraryEntry);
  UCrtC99MathApis::UCrtC99MathApis(&this->ucrtC99MathApis);
  this->loopDepth = '\0';
  ThreadConfiguration::ThreadConfiguration(&this->configuration,(bool)(local_21 & 1));
  this->closedScriptContextCount = 0;
  this->visibilityState = Undefined;
  this->tridentLoadAddress = (void *)0x0;
  this->handlerPropertyId = -1;
  this->TTDContext = (ThreadContextTTD *)0x0;
  this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  this->TTDLog = (EventLog *)0x0;
  this->TTDRootNestingCount = 0;
  this->expirableObjectList = (ExpirableObjectList *)0x0;
  this->expirableObjectDisposeList = (ExpirableObjectList *)0x0;
  this->numExpirableObjects = 0;
  this->expirableCollectModeGcCount = -1;
  this->disableExpiration = false;
  this->callDispose = true;
  this->bailOutByteCodeLocationCount = 0;
  this->interruptPoller = (InterruptPoller *)0x0;
  JsUtil::
  BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->entryPointToBuiltInOperationIdCache,&this->threadAlloc,0);
  ThreadContextRecyclerTelemetryHostInterface::ThreadContextRecyclerTelemetryHostInterface
            (&this->recyclerTelemetryHostInterface,this);
  pAVar6 = &GetThreadAlloc(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,
             (type_info *)
             &JsUtil::Stack<HostScriptContext*,Memory::ArenaAllocator,false,DefaultComparer>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
             ,0xda);
  pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar6,&local_60);
  local_70 = Memory::ArenaAllocator::Alloc;
  local_68 = 0;
  this_00 = (Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
            new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar6,0x3f67b0);
  alloc = GetThreadAlloc(this);
  JsUtil::Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (this_00,alloc);
  this->hostScriptContextStack = this_00;
  this->functionCount = 0;
  this->sourceInfoCount = 0;
  this->scriptContextCount = 0;
  this->isScriptActive = false;
  pAVar6 = &GetThreadAlloc(this)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  uVar3 = GetBailOutRegisterSaveSlotCount();
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&void*::typeinfo,0,(ulong)uVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
             ,0xe8);
  pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar6,&local_98);
  uVar3 = GetBailOutRegisterSaveSlotCount();
  autocs.cs = (CriticalSection *)Memory::ArenaAllocator::AllocZero;
  ppvVar7 = Memory::AllocateArray<Memory::ArenaAllocator,void*,false>
                      ((Memory *)pAVar6,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                       (ulong)uVar3);
  this->bailOutRegisterSaveSpace = ppvVar7;
  this->scriptSiteCount = 0;
  (this->pageAllocator).super_PageAllocator.debugName = L"Thread";
  pDVar8 = DynamicProfileMutator::GetMutator();
  this->dynamicProfileMutator = pDVar8;
  this->rootTrackerScriptContext = (ScriptContext *)0x0;
  DVar2 = ::GetCurrentThreadId();
  this->threadId = DVar2;
  cs = GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection(&local_b0,cs);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::
  LinkToBeginning<ThreadContext>(this,&globalListFirst,&globalListLast);
  Memory::IdleDecommitPageAllocator::UpdateThreadContextHandle(&this->pageAllocator,this);
  if (DAT_01ec73e8 == 0) {
    tVar9 = time((time_t *)0x0);
    local_22c = (uint)tVar9;
  }
  else {
    local_22c = DAT_01ec73e8;
  }
  this->arrayMutationSeed = local_22c;
  srand(this->arrayMutationSeed);
  InitAvailableCommit(this);
  AutoCriticalSection::~AutoCriticalSection(&local_b0);
  return;
}

Assistant:

ThreadContext::ThreadContext(AllocationPolicyManager * allocationPolicyManager, JsUtil::ThreadService::ThreadServiceCallback threadServiceCallback, bool enableExperimentalFeatures) :
    currentThreadId(::GetCurrentThreadId()),
    stackLimitForCurrentThread(0),
    stackProber(nullptr),
    isThreadBound(false),
    hasThrownPendingException(false),
    hasBailedOutBitPtr(nullptr),
    noScriptScope(false),
    heapEnum(nullptr),
    threadContextFlags(ThreadContextFlagNoFlag),
    JsUtil::DoublyLinkedListElement<ThreadContext>(),
    allocationPolicyManager(allocationPolicyManager),
    threadService(threadServiceCallback),
    isOptimizedForManyInstances(Js::Configuration::Global.flags.OptimizeForManyInstances),
    bgJit(Js::Configuration::Global.flags.BgJit),
    pageAllocator(allocationPolicyManager, PageAllocatorType_Thread, Js::Configuration::Global.flags, 0, RecyclerHeuristic::Instance.DefaultMaxFreePageCount,
        false
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        ),
    recycler(nullptr),
    hasCollectionCallBack(false),
    callDispose(true),
#if ENABLE_NATIVE_CODEGEN
    jobProcessor(nullptr),
#endif
    interruptPoller(nullptr),
    expirableCollectModeGcCount(-1),
    expirableObjectList(nullptr),
    expirableObjectDisposeList(nullptr),
    numExpirableObjects(0),
    disableExpiration(false),
    callRootLevel(0),
    nextTypeId((Js::TypeId)Js::Constants::ReservedTypeIds),
    entryExitRecord(nullptr),
    leafInterpreterFrame(nullptr),
    threadServiceWrapper(nullptr),
    tryHandlerAddrOfReturnAddr(nullptr),
    temporaryArenaAllocatorCount(0),
    temporaryGuestArenaAllocatorCount(0),
    crefSContextForDiag(0),
    m_prereservedRegionAddr(0),
    scriptContextList(nullptr),
    scriptContextEverRegistered(false),
#if DBG_DUMP || defined(PROFILE_EXEC)
    topLevelScriptSite(nullptr),
#endif
    polymorphicCacheState(0),
    stackProbeCount(0),
#ifdef BAILOUT_INJECTION
    bailOutByteCodeLocationCount(0),
#endif
    sourceCodeSize(0),
    nativeCodeSize(0),
    threadAlloc(_u("TC"), GetPageAllocator(), Js::Throw::OutOfMemory),
    inlineCacheThreadInfoAllocator(_u("TC-InlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    isInstInlineCacheThreadInfoAllocator(_u("TC-IsInstInlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    equivalentTypeCacheInfoAllocator(_u("TC-EquivalentTypeCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    protoInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 521),
    storeFieldInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 293),
    isInstInlineCacheByFunction(&isInstInlineCacheThreadInfoAllocator, 131),
    registeredInlineCacheCount(0),
    unregisteredInlineCacheCount(0),
    noSpecialPropertyRegistry(this->GetPageAllocator()),
    onlyWritablePropertyRegistry(this->GetPageAllocator()),
    standardUTF8Chars(0),
    standardUnicodeChars(0),
    hasUnhandledException(FALSE),
    hasCatchHandler(FALSE),
    disableImplicitFlags(DisableImplicitNoFlag),
    hasCatchHandlerToUserCode(false),
    caseInvariantPropertySet(nullptr),
    entryPointToBuiltInOperationIdCache(&threadAlloc, 0),
#if ENABLE_NATIVE_CODEGEN
    preReservedVirtualAllocator(),
#if !FLOATVAR
    codeGenNumberThreadAllocator(nullptr),
    xProcNumberPageSegmentManager(nullptr),
#endif
    m_jitNumericProperties(nullptr),
    m_jitNeedsPropertyUpdate(false),
#if DYNAMIC_INTERPRETER_THUNK || defined(ASMJS_PLAT)
    thunkPageAllocators(allocationPolicyManager, /* allocXData */ false, /* virtualAllocator */ nullptr, GetCurrentProcess()),
#endif
    codePageAllocators(allocationPolicyManager, ALLOC_XDATA, GetPreReservedVirtualAllocator(), GetCurrentProcess()),
#if defined(_CONTROL_FLOW_GUARD) && !defined(_M_ARM)
    jitThunkEmitter(this, &VirtualAllocWrapper::Instance , GetCurrentProcess()),
#endif
#endif
    dynamicObjectEnumeratorCacheMap(&HeapAllocator::Instance, 16),
    //threadContextFlags(ThreadContextFlagNoFlag),
#ifdef NTBUILD
    telemetryBlock(&localTelemetryBlock),
#endif
    configuration(enableExperimentalFeatures),
    jsrtRuntime(nullptr),
    propertyMap(nullptr),
    rootPendingClose(nullptr),
    exceptionCode(0),
    isProfilingUserCode(true),
    loopDepth(0),
    redeferralState(InitialRedeferralState),
    gcSinceLastRedeferral(0),
    gcSinceCallCountsCollected(0),
    tridentLoadAddress(nullptr),
    m_remoteThreadContextInfo(nullptr)
#ifdef ENABLE_SCRIPT_DEBUGGING
    , debugManager(nullptr)
#endif
#if ENABLE_TTD
    , TTDContext(nullptr)
    , TTDExecutionInfo(nullptr)
    , TTDLog(nullptr)
    , TTDRootNestingCount(0)
#endif
#ifdef ENABLE_DIRECTCALL_TELEMETRY
    , directCallTelemetry(this)
#endif
#if ENABLE_JS_REENTRANCY_CHECK
    , noJsReentrancy(false)
#endif
    , emptyStringPropertyRecord(nullptr)
    , recyclerTelemetryHostInterface(this)
    , reentrancySafeOrHandled(false)
    , isInReentrancySafeRegion(false)
    , closedScriptContextCount(0)
    , visibilityState(VisibilityState::Undefined)
{
    hostScriptContextStack = Anew(GetThreadAlloc(), JsUtil::Stack<HostScriptContext*>, GetThreadAlloc());

    functionCount = 0;
    sourceInfoCount = 0;
#if DBG || defined(RUNTIME_DATA_COLLECTION)
    scriptContextCount = 0;
#endif
    isScriptActive = false;

#ifdef ENABLE_CUSTOM_ENTROPY
    entropy.Initialize();
#endif

#if ENABLE_NATIVE_CODEGEN
    this->bailOutRegisterSaveSpace = AnewArrayZ(this->GetThreadAlloc(), Js::Var, GetBailOutRegisterSaveSlotCount());
#endif

#if DBG_DUMP
    scriptSiteCount = 0;
    pageAllocator.debugName = _u("Thread");
#endif
#ifdef DYNAMIC_PROFILE_MUTATOR
    this->dynamicProfileMutator = DynamicProfileMutator::GetMutator();
#endif

    PERF_COUNTER_INC(Basic, ThreadContext);

#ifdef LEAK_REPORT
    this->rootTrackerScriptContext = nullptr;
    this->threadId = ::GetCurrentThreadId();
#endif

#ifdef NTBUILD
    memset(&localTelemetryBlock, 0, sizeof(localTelemetryBlock));
#endif

    AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
    ThreadContext::LinkToBeginning(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
#if DBG
    // Since we created our page allocator while we were constructing this thread context
    // it will pick up the thread context id that is current on the thread. We need to update
    // that now.
    pageAllocator.UpdateThreadContextHandle((ThreadContextId)this);
#endif

#if DBG
    arrayMutationSeed = (Js::Configuration::Global.flags.ArrayMutationTestSeed != 0) ? (uint)Js::Configuration::Global.flags.ArrayMutationTestSeed : (uint)time(NULL);
    srand(arrayMutationSeed);
#endif

    this->InitAvailableCommit();
}